

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O1

bool glu::isGLInternalColorFormatFilterable(deUint32 format)

{
  uint uVar1;
  
  if ((int)format < 0x881a) {
    uVar1 = format - 0x8229;
    if (uVar1 < 0x14) {
      if ((0xfffa0U >> (uVar1 & 0x1f) & 1) != 0) {
        return false;
      }
      if ((0x55U >> (uVar1 & 0x1f) & 1) != 0) {
        return true;
      }
    }
    if (8 < format - 0x8051) {
      return false;
    }
    if ((0x1e1U >> (format - 0x8051 & 0x1f) & 1) == 0) {
      return false;
    }
  }
  else if ((int)format < 0x8f94) {
    uVar1 = format - 0x8d62;
    if (uVar1 < 0x2e) {
      if ((0x30c30c30c000U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        return false;
      }
      if ((ulong)uVar1 == 0) {
        return true;
      }
    }
    if (((9 < format - 0x8c3a) || ((0x289U >> (format - 0x8c3a & 0x1f) & 1) == 0)) &&
       (1 < format - 0x881a)) {
      return false;
    }
  }
  else {
    if (0x2a < format - 0x8f94) {
      return false;
    }
    if ((0x6000000000fU >> ((ulong)(format - 0x8f94) & 0x3f) & 1) == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool isGLInternalColorFormatFilterable (deUint32 format)
{
	switch (format)
	{
		case GL_R8:
		case GL_R8_SNORM:
		case GL_RG8:
		case GL_RG8_SNORM:
		case GL_RGB8:
		case GL_RGB8_SNORM:
		case GL_RGB565:
		case GL_RGBA4:
		case GL_RGB5_A1:
		case GL_RGBA8:
		case GL_RGBA8_SNORM:
		case GL_RGB10_A2:
		case GL_SR8_EXT:
		case GL_SRG8_EXT:
		case GL_SRGB8:
		case GL_SRGB8_ALPHA8:
		case GL_R16F:
		case GL_RG16F:
		case GL_RGB16F:
		case GL_RGBA16F:
		case GL_R11F_G11F_B10F:
		case GL_RGB9_E5:
			return true;

		case GL_RGB10_A2UI:
		case GL_R32F:
		case GL_RG32F:
		case GL_RGB32F:
		case GL_RGBA32F:
		case GL_R8I:
		case GL_R8UI:
		case GL_R16I:
		case GL_R16UI:
		case GL_R32I:
		case GL_R32UI:
		case GL_RG8I:
		case GL_RG8UI:
		case GL_RG16I:
		case GL_RG16UI:
		case GL_RG32I:
		case GL_RG32UI:
		case GL_RGB8I:
		case GL_RGB8UI:
		case GL_RGB16I:
		case GL_RGB16UI:
		case GL_RGB32I:
		case GL_RGB32UI:
		case GL_RGBA8I:
		case GL_RGBA8UI:
		case GL_RGBA16I:
		case GL_RGBA16UI:
		case GL_RGBA32I:
		case GL_RGBA32UI:
			return false;

		default:
			DE_ASSERT(false);
			return false;
	}
}